

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     PrintTupleTo<std::tuple<pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&>,2ul>
               (undefined8 *t,ostream *param_2)

{
  PrintTupleTo<std::tuple<pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&>,1ul>
            ();
  std::operator<<(param_2,", ");
  UniversalPrinter<const_pstore::broker::broker_command_&>::Print((broker_command *)*t,param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}